

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

void __thiscall BMP::~BMP(BMP *this)

{
  GreyCount *pGVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  
  pGVar1 = this->alphabet->symbol;
  if (pGVar1 != (GreyCount *)0x0) {
    lVar4 = *(long *)((long)&pGVar1[-1].codeHuffman.field_2 + 8);
    if (lVar4 != 0) {
      paVar3 = &pGVar1[lVar4 + -1].codeShannonFano.field_2;
      lVar4 = lVar4 * -0x80;
      do {
        if (paVar3 + 2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)paVar3[1]._M_allocated_capacity) {
          operator_delete((void *)paVar3[1]._M_allocated_capacity);
        }
        pcVar2 = (((string *)(paVar3 + -1))->_M_dataplus)._M_p;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2);
        }
        if (paVar3 + -2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)paVar3[-3]._M_allocated_capacity) {
          operator_delete((void *)paVar3[-3]._M_allocated_capacity);
        }
        paVar3 = paVar3 + -8;
        lVar4 = lVar4 + 0x80;
      } while (lVar4 != 0);
    }
    operator_delete__(&pGVar1[-1].codeHuffman.field_2);
  }
  if (this->alphabet != (Alphabet *)0x0) {
    operator_delete__(this->alphabet);
  }
  if (0 < (this->headInfo).biWidth) {
    lVar4 = 0;
    do {
      if (this->field[lVar4] != (uchar *)0x0) {
        operator_delete__(this->field[lVar4]);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->headInfo).biWidth);
  }
  if (this->field != (uchar **)0x0) {
    operator_delete__(this->field);
    return;
  }
  return;
}

Assistant:

BMP::~BMP()
{
    using namespace bitMap;

    delete[] alphabet->symbol;
    delete[] alphabet;

    for ( int i = 0; i < headInfo.biWidth; i++ ){
        delete[] field[ i ];
    }
    delete[] field;
}